

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O2

matrix sptk::swipe::loudness(vector x,vector fERBs,double nyquist,int w,int w2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *extraout_RDX_02;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  undefined4 in_register_00000084;
  undefined8 uVar14;
  size_type __n;
  double dVar15;
  double dVar16;
  vector f;
  vector f_00;
  vector f_01;
  vector vVar17;
  matrix L;
  vector yr_vector;
  vector yr_vector_00;
  vector fERBs_00;
  vector fERBs_01;
  vector fERBs_02;
  long local_158;
  allocator_type local_141;
  double *local_140;
  int local_134;
  double local_130;
  double *local_128;
  undefined8 local_120;
  uint local_118;
  int local_114;
  vector<double,_std::allocator<double>_> fi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  fo;
  Buffer buffer;
  RealValuedFastFourierTransform plan;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  
  uVar14 = CONCAT44(in_register_00000084,w);
  local_128 = fERBs.v;
  pdVar13 = x.v;
  local_134 = x.x;
  __n = (size_type)w;
  std::vector<double,_std::allocator<double>_>::vector(&fi,__n,(allocator_type *)&plan);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&plan,__n,(allocator_type *)&buffer);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&fo,2,(value_type *)&plan,&local_141);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&plan);
  RealValuedFastFourierTransform::RealValuedFastFourierTransform(&plan,w2 * 2 + -1,w2 * 2);
  buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00131c68;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar17 = makev(w);
  pdVar8 = vVar17.v;
  local_118 = vVar17.x;
  local_130 = (double)w2;
  uVar12 = 0;
  uVar10 = (ulong)(uint)w;
  if (w < 1) {
    uVar10 = uVar12;
  }
  dVar15 = nyquist / local_130;
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    dVar16 = cos(((double)(int)uVar12 / (double)w) * 6.283185307179586);
    pdVar8[uVar12] = dVar16 * -0.5 + 0.5;
  }
  vVar17 = makev(w2);
  uVar1 = vVar17.x;
  uVar4 = 0;
  uVar12 = 0;
  if (0 < w2) {
    uVar12 = (ulong)(uint)w2;
  }
  for (; uVar12 != uVar4; uVar4 = uVar4 + 1) {
    vVar17.v[uVar4] = (double)(int)uVar4 * dVar15;
  }
  vVar17._0_8_ = vVar17.v;
  local_140 = vVar17.v;
  iVar2 = bisectv((swipe *)(ulong)uVar1,vVar17,*local_128);
  local_120 = CONCAT44(extraout_var,iVar2);
  dVar15 = ceil((double)local_134 / local_130);
  L = makem((int)(dVar15 + 1.0),fERBs.x);
  uVar4 = L._0_8_;
  for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
    fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar6] = 0.0;
  }
  lVar7 = (long)w2;
  for (; (long)uVar12 < (long)__n; uVar12 = uVar12 + 1) {
    fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar12] = pdVar13[uVar12 - lVar7] * pdVar8[uVar12];
  }
  f._4_4_ = 0;
  f.x = uVar1;
  f.v = local_140;
  fERBs_00.v = local_128;
  fERBs_00._0_8_ = uVar14;
  local_130 = (double)lVar7;
  La(L,f,fERBs_00,&plan,&fi,&fo,&buffer,w2,(int)local_120,0);
  iVar3 = L.x;
  local_114 = iVar3 + -2;
  local_158 = 0;
  pdVar9 = extraout_RDX;
  for (iVar2 = 1; iVar2 < local_114; iVar2 = iVar2 + 1) {
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar12] = pdVar13[uVar12] * pdVar8[uVar12];
    }
    f_00._4_4_ = 0;
    f_00.x = uVar1;
    f_00.v = local_140;
    fERBs_01.v = local_128;
    fERBs_01._0_8_ = uVar14;
    La(L,f_00,fERBs_01,&plan,&fi,&fo,&buffer,w2,(int)local_120,iVar2);
    local_158 = local_158 + (long)local_130;
    pdVar13 = pdVar13 + lVar7;
    pdVar9 = extraout_RDX_00;
  }
  lVar11 = (long)local_134;
  for (; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    for (lVar5 = 0; lVar5 < lVar11 - local_158; lVar5 = lVar5 + 1) {
      fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = pdVar13[lVar5] * pdVar8[lVar5];
    }
    for (; lVar5 < (long)__n; lVar5 = lVar5 + 1) {
      fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = 0.0;
    }
    f_01._4_4_ = 0;
    f_01.x = uVar1;
    f_01.v = local_140;
    fERBs_02.v = local_128;
    fERBs_02._0_8_ = uVar14;
    La(L,f_01,fERBs_02,&plan,&fi,&fo,&buffer,w2,(int)local_120,iVar2);
    local_158 = local_158 + (long)local_130;
    pdVar13 = pdVar13 + lVar7;
    pdVar9 = extraout_RDX_01;
  }
  yr_vector.v = pdVar9;
  yr_vector._0_8_ = pdVar8;
  freev((swipe *)(ulong)local_118,yr_vector);
  yr_vector_00.v = extraout_RDX_02;
  yr_vector_00._0_8_ = local_140;
  freev((swipe *)(ulong)uVar1,yr_vector_00);
  uVar12 = 0;
  uVar10 = uVar4 >> 0x20;
  if (L.y == 0 || (long)uVar4 < 0) {
    uVar10 = uVar12;
  }
  uVar6 = 0;
  if (0 < iVar3) {
    uVar6 = uVar4 & 0xffffffff;
  }
  for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
    dVar15 = 0.0;
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      dVar16 = L.m[uVar12][uVar4];
      dVar15 = dVar15 + dVar16 * dVar16;
    }
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        pdVar8 = L.m[uVar12];
        pdVar8[uVar4] = pdVar8[uVar4] / dVar15;
      }
    }
  }
  RealValuedFastFourierTransform::Buffer::~Buffer(&buffer);
  RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&plan);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&fo);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&fi.super__Vector_base<double,_std::allocator<double>_>);
  return L;
}

Assistant:

matrix loudness(vector x, vector fERBs, double nyquist, int w, int w2) {
    int i, j, hi; 
    int offset = 0;
    double td = nyquist / w2; // this is equivalent to fstep
    // testing showed this configuration of fftw to be fastest
#if 0
    double* fi = fftw_malloc(sizeof(double) * w); 
    fftw_complex* fo = fftw_malloc(sizeof(fftw_complex) * w);
    fftw_plan plan = fftw_plan_dft_r2c_1d(w, fi, fo, FFTW_ESTIMATE); 
#else
    std::vector<double> fi(w); 
    std::vector<std::vector<double> > fo(2, std::vector<double>(w));
    sptk::RealValuedFastFourierTransform plan(w2 * 2 - 1, w2 * 2);
    sptk::RealValuedFastFourierTransform::Buffer buffer;
#endif
    vector hann = makev(w); // this defines the Hann[ing] window
    for (i = 0; i < w; i++) 
        hann.v[i] = .5 - (.5 * cos(2. * M_PI * ((double) i / w)));
    vector f = makev(w2);
    for (i = 0; i < w2; i++) 
        f.v[i] = i * td;
    hi = bisectv(f, fERBs.v[0]); // all calls to La() will begin here
    matrix L = makem(ceil((double) x.x / w2) + 1, fERBs.x); 
    for (j = 0; j < w2; j++) // left boundary case
        fi[j] = 0.; // more explicitly, 0. * hann.v[j]
    for (/* j = w2 */; j < w; j++) 
        fi[j] = x.v[j - w2] * hann.v[j];
#if 0
    La(L, f, fERBs, plan, fo, w2, hi, 0); 
#else
    La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, 0); 
#endif
    for (i = 1; i < L.x - 2; i++) { 
        for (j = 0; j < w; j++) 
            fi[j] = x.v[j + offset] * hann.v[j];
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i); 
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i); 
#endif
        offset += w2;
    }
    for (/* i = L.x - 2; */; i < L.x; i++) { // right two boundary cases
        for (j = 0; j < x.x - offset; j++) // this dies at x.x + w2
            fi[j] = x.v[j + offset] * hann.v[j];
        for (/* j = x.x - offset */; j < w; j++) 
            fi[j] = 0.; // once again, 0. * hann.v[j] 
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i);
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i);
#endif
        offset += w2;
    } // now L is fully valued
    freev(hann);
    freev(f);
    // L must now be normalized
    for (i = 0; i < L.x; i++) { 
        td = 0.; // td is the value of the normalization factor
        for (j = 0; j < L.y; j++) 
            td += L.m[i][j] * L.m[i][j];
        if (td != 0.) { // catches zero-division
            td = sqrt(td);
            for (j = 0; j < L.y; j++) 
                L.m[i][j] /= td;
        } // otherwise, it is already 0.
    } 
#if 0
    fftw_destroy_plan(plan); 
    fftw_free(fi); 
    fftw_free(fo); 
#endif
    return(L);
}